

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O3

Unique<Entry<BrepEdge>_> __thiscall
anurbs::Entry<anurbs::BrepEdge>::create
          (Entry<anurbs::BrepEdge> *this,string *key,shared_ptr<anurbs::BrepEdge> *data)

{
  _Rb_tree_header *p_Var1;
  Attributes *__s;
  Pointer<Attributes> attributes;
  _Head_base<0UL,_anurbs::Attributes_*,_false> local_40;
  shared_ptr<anurbs::Attributes> local_38;
  
  __s = (Attributes *)operator_new(0xc0);
  p_Var1 = &(__s->m_tags)._M_t._M_impl.super__Rb_tree_header;
  memset(__s,0,0xc0);
  (__s->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__s->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(__s->m_userStrings)._M_t._M_impl.super__Rb_tree_header;
  (__s->m_userStrings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__s->m_userStrings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__s->m_layer)._M_dataplus._M_p = (pointer)&(__s->m_layer).field_2;
  (__s->m_color)._M_dataplus._M_p = (pointer)&(__s->m_color).field_2;
  (__s->m_arrowhead)._M_dataplus._M_p = (pointer)&(__s->m_arrowhead).field_2;
  local_40._M_head_impl = __s;
  std::__shared_ptr<anurbs::Attributes,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<anurbs::Attributes,std::default_delete<anurbs::Attributes>,void>
            ((__shared_ptr<anurbs::Attributes,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (unique_ptr<anurbs::Attributes,_std::default_delete<anurbs::Attributes>_> *)&local_40);
  if (local_40._M_head_impl != (Attributes *)0x0) {
    std::default_delete<anurbs::Attributes>::operator()
              ((default_delete<anurbs::Attributes> *)&local_40,local_40._M_head_impl);
  }
  new_<anurbs::Entry<anurbs::BrepEdge>,std::__cxx11::string&,std::shared_ptr<anurbs::BrepEdge>&,std::shared_ptr<anurbs::Attributes>&>
            ((anurbs *)this,key,data,&local_38);
  if (local_38.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (__uniq_ptr_data<anurbs::Entry<anurbs::BrepEdge>,_std::default_delete<anurbs::Entry<anurbs::BrepEdge>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::BrepEdge>,_std::default_delete<anurbs::Entry<anurbs::BrepEdge>_>,_true,_true>
            )this;
}

Assistant:

static Unique<Entry<TData>> create(std::string key,
        std::shared_ptr<TData> data)
    {
        Pointer<Attributes> attributes = new_<Attributes>();
        return new_<Entry<TData>>(key, data, attributes);
    }